

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

int test_layer<ncnn::Slice>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *a,int top_blob_count,
              vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_shapes,float epsilon,
              _func_void_Slice_ptr *func)

{
  int *piVar1;
  void *pvVar2;
  long *plVar3;
  undefined8 uVar4;
  int iVar5;
  Slice *pSVar6;
  int *piVar7;
  Option *opt_00;
  ulong uVar8;
  pointer pMVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *__arg;
  long lVar10;
  undefined8 *puVar11;
  Mat local_128;
  Slice *local_e8;
  float local_dc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> a4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> c;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> b;
  ModelBinFromMatArray mb;
  
  opt_00 = _opt;
  __arg = a;
  local_dc = epsilon;
  pSVar6 = (Slice *)ncnn::create_layer(typeindex);
  if (func != (_func_void_Slice_ptr *)0x0) {
    (*func)(pSVar6);
  }
  opt.use_int8_arithmetic = _opt->use_int8_arithmetic;
  opt.use_packing_layout = _opt->use_packing_layout;
  opt.use_shader_pack8 = _opt->use_shader_pack8;
  opt.use_bf16_storage = _opt->use_bf16_storage;
  opt._36_4_ = *(undefined4 *)&_opt->field_0x24;
  opt.lightmode = _opt->lightmode;
  opt._1_3_ = *(undefined3 *)&_opt->field_0x1;
  opt.num_threads = _opt->num_threads;
  opt.blob_allocator._0_4_ = *(undefined4 *)&_opt->blob_allocator;
  opt.blob_allocator._4_4_ = *(undefined4 *)((long)&_opt->blob_allocator + 4);
  opt.workspace_allocator = _opt->workspace_allocator;
  opt.use_winograd_convolution = _opt->use_winograd_convolution;
  opt.use_sgemm_convolution = _opt->use_sgemm_convolution;
  opt.use_int8_inference = _opt->use_int8_inference;
  opt.use_vulkan_compute = _opt->use_vulkan_compute;
  opt.use_fp16_packed = _opt->use_fp16_packed;
  opt.use_fp16_storage = _opt->use_fp16_storage;
  opt.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  opt.use_int8_storage = _opt->use_int8_storage;
  if ((pSVar6->super_Layer).support_vulkan == false) {
    opt.use_vulkan_compute = false;
  }
  if ((pSVar6->super_Layer).support_packing == false) {
    opt.use_packing_layout = false;
  }
  if ((pSVar6->super_Layer).support_bf16_storage == false) {
    opt.use_bf16_storage = false;
  }
  uVar4 = opt._32_8_;
  if (opt.use_int8_inference == true) {
    opt.use_bf16_storage = false;
    opt.use_int8_arithmetic = SUB81(uVar4,0);
    opt.use_packing_layout = false;
  }
  local_e8 = pSVar6;
  if ((top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (&(pSVar6->super_Layer).bottom_shapes,a);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (&(pSVar6->super_Layer).top_shapes,top_shapes);
  }
  (*(pSVar6->super_Layer)._vptr_Layer[2])(pSVar6,pd);
  if (((pSVar6->super_Layer).one_blob_only == true) &&
     ((long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start != 0x40)) {
    test_layer<ncnn::Slice>();
    iVar5 = -1;
  }
  else {
    ncnn::ModelBinFromMatArray::ModelBinFromMatArray
              (&mb,(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start);
    (*(pSVar6->super_Layer)._vptr_Layer[3])(pSVar6,&mb);
    (*(pSVar6->super_Layer)._vptr_Layer[4])(pSVar6,&opt);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&b,(long)top_blob_count,(allocator_type *)&local_128);
    if ((pSVar6->super_Layer).support_inplace == true) {
      pMVar9 = (a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar9) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          ncnn::Mat::clone(&local_128,(__fn *)((long)&pMVar9->data + lVar10),(void *)0x0,(int)opt_00
                           ,__arg);
          pMVar9 = b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar11 = (undefined8 *)
                    ((long)&(b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->data + lVar10);
          piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          if ((Mat *)puVar11 != &local_128) {
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = *(int **)((long)&(b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->refcount + lVar10)
            ;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pvVar2 = *(void **)((long)&(b.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data +
                                   lVar10);
                plVar3 = *(long **)((long)&(b.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->allocator +
                                   lVar10);
                if (plVar3 == (long *)0x0) {
                  if (pvVar2 != (void *)0x0) {
                    free(pvVar2);
                  }
                }
                else {
                  (**(code **)(*plVar3 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)puVar11 + 0xc) = 0;
            *(undefined8 *)((long)puVar11 + 0x14) = 0;
            *puVar11 = 0;
            puVar11[1] = 0;
            puVar11 = (undefined8 *)((long)&pMVar9->dims + lVar10);
            *puVar11 = 0;
            puVar11[1] = 0;
            *(undefined8 *)((long)&pMVar9->cstep + lVar10) = 0;
            *(void **)((long)&pMVar9->data + lVar10) = local_128.data;
            piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
            *(int **)((long)&pMVar9->refcount + lVar10) = piVar7;
            *(ulong *)((long)&pMVar9->elemsize + lVar10) =
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
            *(int *)((long)&pMVar9->elempack + lVar10) = local_128.elempack;
            *(Allocator **)((long)&pMVar9->allocator + lVar10) = local_128.allocator;
            piVar1 = (int *)((long)&pMVar9->dims + lVar10);
            *piVar1 = local_128.dims;
            piVar1[1] = local_128.w;
            piVar1[2] = local_128.h;
            piVar1[3] = local_128.c;
            *(size_t *)((long)&pMVar9->cstep + lVar10) = local_128.cstep;
            opt_00 = (Option *)local_128.cstep;
          }
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (**(code **)(*(long *)local_128.allocator + 0x18))();
              }
            }
          }
          uVar8 = uVar8 + 1;
          pMVar9 = (a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x40;
        } while (uVar8 < (ulong)((long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >>
                                6));
      }
      ncnn::Layer::forward_inplace(&local_e8->super_Layer,&b,&opt);
    }
    else {
      opt_00 = &opt;
      ncnn::Slice::forward(pSVar6,a,&b,opt_00);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&c,(long)top_blob_count,(allocator_type *)&local_128);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&a4,(long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_128);
    if (opt.use_packing_layout == true) {
      pMVar9 = (a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar9) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          opt_00 = &opt;
          ncnn::convert_packing
                    ((Mat *)((long)&pMVar9->data + lVar10),
                     (Mat *)((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->data + lVar10),4,
                     &opt);
          uVar8 = uVar8 + 1;
          pMVar9 = (a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x40;
        } while (uVar8 < (ulong)((long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >>
                                6));
      }
    }
    else {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(&a4,a);
    }
    if ((opt.use_bf16_storage == true) &&
       (a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
        ._M_start)) {
      lVar10 = 0;
      uVar8 = 0;
      do {
        local_128.elemsize._0_4_ = 0;
        local_128.elemsize._4_4_ = 0;
        local_128.elempack = 0;
        local_128.data = (void *)0x0;
        local_128.refcount._0_4_ = 0;
        local_128.refcount._4_4_ = 0;
        local_128.h = 0;
        local_128.c = 0;
        local_128.cstep = 0;
        local_128.allocator = (Allocator *)0x0;
        local_128.dims = 0;
        local_128.w = 0;
        ncnn::cast_float32_to_bfloat16
                  ((Mat *)((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar10),
                   &local_128,&opt);
        pMVar9 = a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar11 = (undefined8 *)
                  ((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start)->data + lVar10);
        piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
        if ((Mat *)puVar11 != &local_128) {
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = *(int **)((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar10);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar2 = *(void **)((long)&(a4.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar10);
              plVar3 = *(long **)((long)&(a4.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar10);
              if (plVar3 == (long *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)puVar11 + 0xc) = 0;
          *(undefined8 *)((long)puVar11 + 0x14) = 0;
          *puVar11 = 0;
          puVar11[1] = 0;
          puVar11 = (undefined8 *)((long)&pMVar9->dims + lVar10);
          *puVar11 = 0;
          puVar11[1] = 0;
          *(undefined8 *)((long)&pMVar9->cstep + lVar10) = 0;
          *(void **)((long)&pMVar9->data + lVar10) = local_128.data;
          piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          *(int **)((long)&pMVar9->refcount + lVar10) = piVar7;
          *(ulong *)((long)&pMVar9->elemsize + lVar10) =
               CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
          *(int *)((long)&pMVar9->elempack + lVar10) = local_128.elempack;
          *(Allocator **)((long)&pMVar9->allocator + lVar10) = local_128.allocator;
          piVar1 = (int *)((long)&pMVar9->dims + lVar10);
          *piVar1 = local_128.dims;
          piVar1[1] = local_128.w;
          piVar1[2] = local_128.h;
          piVar1[3] = local_128.c;
          *(size_t *)((long)&pMVar9->cstep + lVar10) = local_128.cstep;
          opt_00 = (Option *)local_128.cstep;
        }
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (**(code **)(*(long *)local_128.allocator + 0x18))();
            }
          }
        }
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x40;
      } while (uVar8 < (ulong)((long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 6));
    }
    if ((local_e8->super_Layer).support_inplace == true) {
      if (a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          ncnn::Mat::clone(&local_128,
                           (__fn *)((long)&(a4.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data +
                                   lVar10),(void *)0x0,(int)opt_00,__arg);
          pMVar9 = c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar11 = (undefined8 *)
                    ((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->data + lVar10);
          piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          if ((Mat *)puVar11 != &local_128) {
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = *(int **)((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->refcount + lVar10)
            ;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pvVar2 = *(void **)((long)&(c.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data +
                                   lVar10);
                plVar3 = *(long **)((long)&(c.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->allocator +
                                   lVar10);
                if (plVar3 == (long *)0x0) {
                  if (pvVar2 != (void *)0x0) {
                    free(pvVar2);
                  }
                }
                else {
                  (**(code **)(*plVar3 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)puVar11 + 0xc) = 0;
            *(undefined8 *)((long)puVar11 + 0x14) = 0;
            *puVar11 = 0;
            puVar11[1] = 0;
            puVar11 = (undefined8 *)((long)&pMVar9->dims + lVar10);
            *puVar11 = 0;
            puVar11[1] = 0;
            *(undefined8 *)((long)&pMVar9->cstep + lVar10) = 0;
            *(void **)((long)&pMVar9->data + lVar10) = local_128.data;
            piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
            *(int **)((long)&pMVar9->refcount + lVar10) = piVar7;
            *(ulong *)((long)&pMVar9->elemsize + lVar10) =
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
            *(int *)((long)&pMVar9->elempack + lVar10) = local_128.elempack;
            *(Allocator **)((long)&pMVar9->allocator + lVar10) = local_128.allocator;
            piVar1 = (int *)((long)&pMVar9->dims + lVar10);
            *piVar1 = local_128.dims;
            piVar1[1] = local_128.w;
            piVar1[2] = local_128.h;
            piVar1[3] = local_128.c;
            *(size_t *)((long)&pMVar9->cstep + lVar10) = local_128.cstep;
            opt_00 = (Option *)local_128.cstep;
          }
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (**(code **)(*(long *)local_128.allocator + 0x18))();
              }
            }
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x40;
        } while (uVar8 < (ulong)((long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 6));
      }
      (*(local_e8->super_Layer)._vptr_Layer[8])(local_e8,&c,&opt);
    }
    else {
      (*(local_e8->super_Layer)._vptr_Layer[6])(local_e8,&a4,&c,&opt);
    }
    if ((opt.use_bf16_storage == true) &&
       (c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
        _M_start)) {
      lVar10 = 0;
      uVar8 = 0;
      do {
        local_128.elemsize._0_4_ = 0;
        local_128.elemsize._4_4_ = 0;
        local_128.elempack = 0;
        local_128.data = (void *)0x0;
        local_128.refcount._0_4_ = 0;
        local_128.refcount._4_4_ = 0;
        local_128.h = 0;
        local_128.c = 0;
        local_128.cstep = 0;
        local_128.allocator = (Allocator *)0x0;
        local_128.dims = 0;
        local_128.w = 0;
        ncnn::cast_bfloat16_to_float32
                  ((Mat *)((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar10),
                   &local_128,&opt);
        pMVar9 = c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar11 = (undefined8 *)
                  ((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start)->data + lVar10);
        piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
        if ((Mat *)puVar11 != &local_128) {
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = *(int **)((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar10);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar2 = *(void **)((long)&(c.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar10);
              plVar3 = *(long **)((long)&(c.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar10);
              if (plVar3 == (long *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)puVar11 + 0xc) = 0;
          *(undefined8 *)((long)puVar11 + 0x14) = 0;
          *puVar11 = 0;
          puVar11[1] = 0;
          puVar11 = (undefined8 *)((long)&pMVar9->dims + lVar10);
          *puVar11 = 0;
          puVar11[1] = 0;
          *(undefined8 *)((long)&pMVar9->cstep + lVar10) = 0;
          *(void **)((long)&pMVar9->data + lVar10) = local_128.data;
          piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          *(int **)((long)&pMVar9->refcount + lVar10) = piVar7;
          *(ulong *)((long)&pMVar9->elemsize + lVar10) =
               CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
          *(int *)((long)&pMVar9->elempack + lVar10) = local_128.elempack;
          *(Allocator **)((long)&pMVar9->allocator + lVar10) = local_128.allocator;
          piVar1 = (int *)((long)&pMVar9->dims + lVar10);
          *piVar1 = local_128.dims;
          piVar1[1] = local_128.w;
          piVar1[2] = local_128.h;
          piVar1[3] = local_128.c;
          *(size_t *)((long)&pMVar9->cstep + lVar10) = local_128.cstep;
        }
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (**(code **)(*(long *)local_128.allocator + 0x18))();
            }
          }
        }
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x40;
      } while (uVar8 < (ulong)((long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 6));
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&a4);
    pSVar6 = local_e8;
    (*(local_e8->super_Layer)._vptr_Layer[5])(local_e8,&opt);
    (*(pSVar6->super_Layer)._vptr_Layer[1])(pSVar6);
    if ((long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start >> 6 ==
        (long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start >> 6) {
      if (b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          iVar5 = CompareMat((Mat *)((long)&(b.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->data +
                                    lVar10),
                             (Mat *)((long)&(c.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->data +
                                    lVar10),local_dc);
          if (iVar5 != 0) {
            fprintf(_stderr,"output blob %zu not match\n",uVar8);
            goto LAB_00115793;
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x40;
        } while (uVar8 < (ulong)((long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 6));
      }
      iVar5 = 0;
      if ((top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar5 = test_layer<ncnn::Slice>(typeindex,pd,weights,&opt,a,top_blob_count,&b,local_dc,func)
        ;
      }
    }
    else {
      fprintf(_stderr,"output blob count not match %zu %zu\n");
LAB_00115793:
      test_layer<ncnn::Slice>();
      iVar5 = -1;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&c);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&b);
    ncnn::ModelBin::~ModelBin(&mb.super_ModelBin);
  }
  return iVar5;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const std::vector<ncnn::Mat>& a, int top_blob_count, const std::vector<ncnn::Mat>& top_shapes = std::vector<ncnn::Mat>(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);

    if (func)
    {
        (*func)((T*)op);
    }

    ncnn::Option opt = _opt;

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (!top_shapes.empty())
    {
        op->bottom_shapes = a;
        op->top_shapes = top_shapes;
    }

    op->load_param(pd);

    if (op->one_blob_only && a.size() != 1)
    {
        fprintf(stderr, "layer with one_blob_only but consume multiple inputs\n");
        delete op;
        return -1;
    }

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    std::vector<ncnn::Mat> b(top_blob_count);
    if (op->support_inplace)
    {
        for (size_t i=0; i<a.size(); i++)
        {
            b[i] = a[i].clone();
        }

        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    std::vector<ncnn::Mat> c(top_blob_count);
    {
        std::vector<ncnn::Mat> a4(a.size());
        if (opt.use_packing_layout)
        {
            for (size_t i=0; i<a.size(); i++)
            {
                ncnn::convert_packing(a[i], a4[i], 4, opt);
            }
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            for (size_t i=0; i<a4.size(); i++)
            {
                ncnn::Mat a_bf16;
                ncnn::cast_float32_to_bfloat16(a4[i], a_bf16, opt);
                a4[i] = a_bf16;
            }
        }

        if (op->support_inplace)
        {
            for (size_t i=0; i<a4.size(); i++)
            {
                c[i] = a4[i].clone();
            }

            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            for (size_t i=0; i<c.size(); i++)
            {
                ncnn::Mat c_fp32;
                ncnn::cast_bfloat16_to_float32(c[i], c_fp32, opt);
                c[i] = c_fp32;
            }
        }
    }

#if NCNN_VULKAN
    std::vector<ncnn::Mat> d(top_blob_count);
    if (opt.use_vulkan_compute)
    {
        // pack
        std::vector<ncnn::Mat> a4(a.size());
        for (size_t i=0; i<a.size(); i++)
        {
            if (opt.use_shader_pack8)
            {
                ncnn::convert_packing(a[i], a4[i], 8, opt);
                if (a4[i].elempack == 1)
                    ncnn::convert_packing(a[i], a4[i], 4, opt);
            }
            else
                ncnn::convert_packing(a[i], a4[i], 4, opt);
        }

        // fp16
        std::vector<ncnn::Mat> a4_fp16(a4.size());
        for (size_t i=0; i<a4.size(); i++)
        {
            if (opt.use_fp16_storage || ((a4[i].elempack == 4 || a4[i].elempack == 8) && opt.use_fp16_packed))
            {
                ncnn::cast_float32_to_float16(a4[i], a4_fp16[i], opt);
            }
            else
            {
                a4_fp16[i] = a4[i];
            }
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        std::vector<ncnn::VkMat> a4_fp16_gpu(a4_fp16.size());
        for (size_t i=0; i<a4_fp16_gpu.size(); i++)
        {
            cmd.record_upload(a4_fp16[i], a4_fp16_gpu[i], opt);
        }

        std::vector<ncnn::VkMat> d4_fp16_gpu(top_blob_count);
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        for (size_t i=0; i<d4_fp16_gpu.size(); i++)
        {
            cmd.record_download(d4_fp16_gpu[i], d[i], opt);
        }

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shapes.empty())
        return test_layer<T>(typeindex, pd, weights, opt, a, top_blob_count, b, epsilon, func);

    return 0;
}